

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_range.cc
# Opt level: O3

void re2c::UTF16splitByRuneLength(RangeSuffix **root,rune l,rune h)

{
  uint32_t l_tr;
  uint32_t l_ld;
  
  if (l < 0x10000) {
    if (h < 0x10000) {
      UTF16addContinuous1(root,l,h);
      return;
    }
    UTF16addContinuous1(root,l,0xffff);
    l_ld = 0xd800;
    l_tr = 0xdc00;
  }
  else {
    l_ld = (l - 0x10000 >> 10) + 0xd800;
    l_tr = (l & 0x3ff) + 0xdc00;
  }
  UTF16splitByContinuity(root,l_ld,(h - 0x10000 >> 10) + 0xd800,l_tr,(h & 0x3ff) + 0xdc00);
  return;
}

Assistant:

void UTF16splitByRuneLength(RangeSuffix * & root, utf16::rune l, utf16::rune h)
{
	if (l <= utf16::MAX_1WORD_RUNE)
	{
		if (h <= utf16::MAX_1WORD_RUNE)
		{
			UTF16addContinuous1(root, l, h);
		}
		else
		{
			UTF16addContinuous1(root, l, utf16::MAX_1WORD_RUNE);
			const uint32_t h_ld = utf16::lead_surr(h);
			const uint32_t h_tr = utf16::trail_surr(h);
			UTF16splitByContinuity(root, utf16::MIN_LEAD_SURR, h_ld, utf16::MIN_TRAIL_SURR, h_tr);
		}
	}
	else
	{
			const uint32_t l_ld = utf16::lead_surr(l);
			const uint32_t l_tr = utf16::trail_surr(l);
			const uint32_t h_ld = utf16::lead_surr(h);
			const uint32_t h_tr = utf16::trail_surr(h);
			UTF16splitByContinuity(root, l_ld, h_ld, l_tr, h_tr);
	}
}